

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O2

string * __thiscall
LTFlightData::ComposeLabel_abi_cxx11_(string *__return_storage_ptr__,LTFlightData *this)

{
  LTAircraft *pLVar1;
  LabelCfgTy LVar2;
  bool bVar3;
  long lVar4;
  char *__s;
  allocator<char> local_71;
  LTChannel *pChn;
  string label;
  
  std::recursive_mutex::lock(&this->dataAccessMutex);
  LVar2 = dataRefs.labelCfg;
  std::__cxx11::string::string((string *)&label,(string *)&this->labelStat);
  pLVar1 = this->pAc;
  if (pLVar1 != (LTAircraft *)0x0) {
    if ((dataRefs.bLabelForParked == 0) && (pLVar1->phase == FPH_PARKED)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)&pChn);
      goto LAB_0015aad1;
    }
    if (((uint)LVar2 >> 8 & 1) != 0) {
      LTAircraft::GetFlightPhaseString_abi_cxx11_((string *)&pChn,pLVar1);
      std::__cxx11::string::append((string *)&label);
      std::__cxx11::string::~string((string *)&pChn);
      trim(&label," \t\f\v\r\n");
      std::__cxx11::string::push_back((char)&label);
    }
    if (((uint)LVar2 >> 9 & 1) != 0) {
      lVar4 = lround((pLVar1->ppos)._head);
      std::__cxx11::to_string((string *)&pChn,lVar4);
      std::__cxx11::string::append((string *)&label);
      std::__cxx11::string::~string((string *)&pChn);
      std::__cxx11::string::push_back((char)&label);
    }
    if (((uint)LVar2 >> 10 & 1) != 0) {
      lVar4 = lround((pLVar1->ppos)._alt / 0.3048);
      std::__cxx11::to_string((string *)&pChn,lVar4);
      std::__cxx11::string::append((string *)&label);
      std::__cxx11::string::~string((string *)&pChn);
      std::__cxx11::string::push_back((char)&label);
    }
    if (((uint)LVar2 >> 0xb & 1) != 0) {
      pLVar1 = this->pAc;
      if ((pLVar1->super_Aircraft).bOnGrnd == true) {
        __s = positionTy::GrndE2String(GND_ON);
        std::__cxx11::string::string<std::allocator<char>>((string *)&pChn,__s,&local_71);
      }
      else {
        std::__cxx11::to_string
                  ((string *)&pChn,(long)(((pLVar1->ppos)._alt - pLVar1->terrainAlt_m) / 0.3048));
      }
      std::__cxx11::string::append((string *)&label);
      std::__cxx11::string::~string((string *)&pChn);
      trim(&label," \t\f\v\r\n");
      std::__cxx11::string::push_back((char)&label);
    }
    if (((uint)LVar2 >> 0xc & 1) != 0) {
      lVar4 = lround((this->pAc->speed).currSpeed_kt);
      std::__cxx11::to_string((string *)&pChn,lVar4);
      std::__cxx11::string::append((string *)&label);
      std::__cxx11::string::~string((string *)&pChn);
      std::__cxx11::string::push_back((char)&label);
    }
    if (((uint)LVar2 >> 0xd & 1) != 0) {
      lVar4 = lround(this->pAc->vsi);
      std::__cxx11::to_string((string *)&pChn,lVar4);
      std::__cxx11::string::append((string *)&label);
      std::__cxx11::string::~string((string *)&pChn);
      std::__cxx11::string::push_back((char)&label);
    }
    if (((uint)LVar2 >> 0xe & 1) != 0) {
      pChn = (LTChannel *)0x0;
      bVar3 = GetCurrChannel(this,&pChn);
      if (bVar3 && pChn != (LTChannel *)0x0) {
        std::__cxx11::string::append((char *)&label);
        std::__cxx11::string::push_back((char)&label);
      }
    }
  }
  if (label._M_string_length != 0) {
    std::__cxx11::string::pop_back();
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)label._M_dataplus._M_p == &label.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(label.field_2._M_allocated_capacity._1_7_,label.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = label.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = label._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(label.field_2._M_allocated_capacity._1_7_,label.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = label._M_string_length;
  label._M_string_length = 0;
  label.field_2._M_local_buf[0] = '\0';
  label._M_dataplus._M_p = (pointer)&label.field_2;
LAB_0015aad1:
  std::__cxx11::string::~string((string *)&label);
  pthread_mutex_unlock((pthread_mutex_t *)&this->dataAccessMutex);
  return __return_storage_ptr__;
}

Assistant:

std::string LTFlightData::ComposeLabel() const
{
    try {
        // access guarded by a mutex
        std::lock_guard<std::recursive_mutex> lock (dataAccessMutex);

        // the configuration: which parts to include in the label?
        const DataRefs::LabelCfgTy cfg = dataRefs.GetLabelCfg();
        std::string label(labelStat);       // copy static parts
        
        // only possible if we have an aircraft
        if (pAc) {
            // If aircraft is parked and we shall not show labels for parked a/c, then return nothing
            if (!dataRefs.LabelShowForParked() &&
                pAc->GetFlightPhase() == FPH_PARKED)
                return "";
            
            // current position of a/c
            const positionTy& pos = pAc->GetPPos();
            // add more items as per configuration
            if (cfg.bPhase) { label +=  pAc->GetFlightPhaseString(); trim(label); label += ' '; }
            ADD_LABEL_NUM(cfg.bHeading,     pos.heading());
            ADD_LABEL_NUM(cfg.bAlt,         pos.alt_ft());
            if (cfg.bHeightAGL) {
                label += pAc->IsOnGrnd() ? positionTy::GrndE2String(GND_ON) :
                           std::to_string(long(pAc->GetPHeight_ft()));
                trim(label);
                label += ' ';
            }
            ADD_LABEL_NUM(cfg.bSpeed,       pAc->GetSpeed_kt());
            ADD_LABEL_NUM(cfg.bVSI,         pAc->GetVSI_ft());
            if (cfg.bChannel) {
                const LTChannel* pChn = nullptr;
                if (GetCurrChannel(pChn) && pChn) {
                    label += pChn->ChName();
                    label += ' ';
                }
            }
        }
        
        // remove the trailing space
        if (!label.empty())
            label.pop_back();
        
        return label;
        
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, key().c_str(), e.what());
    }
    return "?";
}